

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O2

double * inform_integration_evidence_part
                   (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,
                   double *evidence,inform_error *err)

{
  _Bool _Var1;
  size_t i;
  size_t *parts_00;
  size_t sVar2;
  int *series_00;
  double *pdVar3;
  inform_error iVar4;
  double *local_40;
  
  if (series == (int *)0x0) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar4 = INFORM_ETIMESERIES;
  }
  else {
    if (1 < l) {
      local_40 = evidence;
      if ((evidence == (double *)0x0) &&
         (local_40 = (double *)malloc(n << 4), local_40 == (double *)0x0)) {
        if (err == (inform_error *)0x0) {
          return (double *)0x0;
        }
        *err = INFORM_ENOMEM;
        return (double *)0x0;
      }
      parts_00 = parts;
      if (parts == (size_t *)0x0) {
        parts_00 = (size_t *)malloc(l * 8);
        if (parts_00 == (size_t *)0x0) {
          if (evidence == (double *)0x0) {
            free(local_40);
          }
          if (err == (inform_error *)0x0) {
            return (double *)0x0;
          }
          *err = INFORM_ENOMEM;
          return (double *)0x0;
        }
        for (sVar2 = 0; nparts = l, l != sVar2; sVar2 = sVar2 + 1) {
          parts_00[sVar2] = sVar2;
        }
      }
      series_00 = inform_black_box_parts(series,l,n,b,parts_00,nparts,(int *)0x0,err);
      _Var1 = inform_succeeded(err);
      if (_Var1) {
        inform_local_mutual_info(series_00,nparts,n,series_00 + nparts * n,local_40,err);
      }
      free(series_00);
      if (parts == (size_t *)0x0) {
        free(parts_00);
      }
      _Var1 = inform_failed(err);
      pdVar3 = (double *)0x0;
      if (!_Var1) {
        pdVar3 = local_40;
      }
      if (_Var1 && evidence == (double *)0x0) {
        free(local_40);
        return (double *)0x0;
      }
      return pdVar3;
    }
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    iVar4 = INFORM_ENOSOURCES;
  }
  *err = iVar4;
  return (double *)0x0;
}

Assistant:

double *inform_integration_evidence_part(int const *series, size_t l, size_t n,
    int const *b, size_t const *parts, size_t nparts, double *evidence,
    inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate_evidence = (evidence == NULL);
    if (allocate_evidence)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    size_t *partitioning = (size_t *)parts;
    int allocate_parts = (partitioning == NULL);
    if (allocate_parts)
    {
        partitioning = malloc(l * sizeof(size_t));
        if (partitioning == NULL)
        {
            if (allocate_evidence) free(evidence);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) partitioning[i] = i;
        nparts = l;
    }
    int *partitioned = inform_black_box_parts(series, l, n, b, partitioning,
        nparts, NULL, err);
    if (inform_succeeded(err))
    {
        inform_local_mutual_info(partitioned, nparts, n, partitioned + nparts*n,
            evidence, err);
    }
    free(partitioned);
    if (allocate_parts) free(partitioning);
    if (inform_failed(err))
    {
        if (allocate_evidence) free(evidence);
        return NULL;
    }
    return evidence;
}